

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
spvtools::val::Instruction::RegisterUse(Instruction *this,Instruction *inst,uint32_t index)

{
  pair<const_spvtools::val::Instruction_*,_unsigned_int> pVar1;
  value_type local_30;
  uint32_t local_1c;
  Instruction *pIStack_18;
  uint32_t index_local;
  Instruction *inst_local;
  Instruction *this_local;
  
  local_1c = index;
  pIStack_18 = inst;
  inst_local = this;
  pVar1 = std::make_pair<spvtools::val::Instruction_const*&,unsigned_int&>
                    (&stack0xffffffffffffffe8,&local_1c);
  local_30.first = pVar1.first;
  local_30.second = pVar1.second;
  std::
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  ::push_back(&this->uses_,&local_30);
  return;
}

Assistant:

void Instruction::RegisterUse(const Instruction* inst, uint32_t index) {
  uses_.push_back(std::make_pair(inst, index));
}